

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExtras.h
# Opt level: O1

void llvm::function_ref<void(llvm::Error)>::callback_fn<void(llvm::Error)>
               (intptr_t callable,Error *params)

{
  ErrorInfoBase *pEVar1;
  long *plVar2;
  
  pEVar1 = params->Payload;
  params->Payload = (ErrorInfoBase *)0x0;
  (*(code *)callable)();
  plVar2 = (long *)((ulong)pEVar1 & 0xfffffffffffffffe);
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 8))();
  }
  return;
}

Assistant:

static Ret callback_fn(intptr_t callable, Params ...params) {
    return (*reinterpret_cast<Callable*>(callable))(
        std::forward<Params>(params)...);
  }